

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O3

int mbedtls_x509_get_time(uchar **p,uchar *end,mbedtls_x509_time *tm)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  uchar *puVar4;
  uchar *puVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  size_t len;
  ulong local_28;
  
  puVar4 = *p;
  local_28 = (long)end - (long)puVar4;
  if ((long)local_28 < 1) {
    return -0x2460;
  }
  if (*puVar4 == '\x17') {
    lVar8 = 2;
    bVar1 = true;
  }
  else {
    if (*puVar4 != '\x18') {
      return -0x2462;
    }
    lVar8 = 4;
    bVar1 = false;
  }
  *p = puVar4 + 1;
  iVar2 = mbedtls_asn1_get_len(p,end,&local_28);
  if (iVar2 == 0) {
    iVar2 = -0x2400;
    uVar3 = local_28 - (lVar8 + 8U);
    if (lVar8 + 8U <= local_28) {
      tm->year = 0;
      puVar4 = *p + 1;
      iVar7 = 0;
      do {
        if ((byte)(puVar4[-1] - 0x3a) < 0xf6) {
          return -0x2400;
        }
        tm->year = iVar7 * 10;
        *p = puVar4;
        iVar6 = iVar7 * 10 + (uint)puVar4[-1];
        iVar7 = iVar6 + -0x30;
        tm->year = iVar7;
        puVar4 = puVar4 + 1;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
      if (bVar1) {
        iVar6 = iVar6 + 0x34;
        if (0x31 < iVar7) {
          iVar6 = iVar7;
        }
        tm->year = iVar6 + 0x76c;
      }
      tm->mon = 0;
      iVar7 = 0;
      lVar8 = -2;
      do {
        if ((byte)(puVar4[-1] - 0x3a) < 0xf6) {
          return -0x2400;
        }
        tm->mon = iVar7 * 10;
        *p = puVar4;
        iVar7 = iVar7 * 10 + (uint)puVar4[-1] + -0x30;
        tm->mon = iVar7;
        puVar4 = puVar4 + 1;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0);
      tm->day = 0;
      iVar7 = 0;
      lVar8 = -2;
      do {
        if ((byte)(puVar4[-1] - 0x3a) < 0xf6) {
          return -0x2400;
        }
        tm->day = iVar7 * 10;
        *p = puVar4;
        iVar7 = iVar7 * 10 + (uint)puVar4[-1] + -0x30;
        tm->day = iVar7;
        puVar4 = puVar4 + 1;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0);
      tm->hour = 0;
      iVar7 = 0;
      lVar8 = -2;
      do {
        if ((byte)(puVar4[-1] - 0x3a) < 0xf6) {
          return -0x2400;
        }
        tm->hour = iVar7 * 10;
        *p = puVar4;
        iVar7 = iVar7 * 10 + (uint)puVar4[-1] + -0x30;
        tm->hour = iVar7;
        puVar4 = puVar4 + 1;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0);
      tm->min = 0;
      iVar7 = 0;
      lVar8 = -2;
      do {
        if ((byte)(puVar4[-1] - 0x3a) < 0xf6) {
          return -0x2400;
        }
        tm->min = iVar7 * 10;
        *p = puVar4;
        iVar7 = iVar7 * 10 + (uint)puVar4[-1] + -0x30;
        tm->min = iVar7;
        puVar4 = puVar4 + 1;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0);
      if (1 < uVar3) {
        tm->sec = 0;
        iVar2 = 0;
        lVar8 = -2;
        do {
          puVar5 = puVar4;
          if ((byte)(puVar5[-1] - 0x3a) < 0xf6) {
            return -0x2400;
          }
          tm->sec = iVar2 * 10;
          *p = puVar5;
          iVar2 = iVar2 * 10 + (uint)puVar5[-1] + -0x30;
          tm->sec = iVar2;
          lVar8 = lVar8 + 1;
          puVar4 = puVar5 + 1;
        } while (lVar8 != 0);
        if (uVar3 != 2) {
          if (uVar3 != 3) {
            return -0x2400;
          }
          if (*puVar5 != 'Z') {
            return -0x2400;
          }
          *p = puVar5 + 1;
        }
        iVar2 = x509_date_is_valid(tm);
      }
    }
  }
  else {
    iVar2 = iVar2 + -0x2400;
  }
  return iVar2;
}

Assistant:

int mbedtls_x509_get_time( unsigned char **p, const unsigned char *end,
                           mbedtls_x509_time *tm )
{
    int ret;
    size_t len, year_len;
    unsigned char tag;

    if( ( end - *p ) < 1 )
        return( MBEDTLS_ERR_X509_INVALID_DATE +
                MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    tag = **p;

    if( tag == MBEDTLS_ASN1_UTC_TIME )
        year_len = 2;
    else if( tag == MBEDTLS_ASN1_GENERALIZED_TIME )
        year_len = 4;
    else
        return( MBEDTLS_ERR_X509_INVALID_DATE +
                MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );

    (*p)++;
    ret = mbedtls_asn1_get_len( p, end, &len );

    if( ret != 0 )
        return( MBEDTLS_ERR_X509_INVALID_DATE + ret );

    return x509_parse_time( p, len, year_len, tm );
}